

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

char * ucs4_to_utf8(ucs4_t *ucs4,size_t length)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined1 *__ptr;
  char *pcVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar12 = 0;
  uVar4 = -(ulong)(length == 0) | length + (length == 0);
  do {
    uVar13 = uVar12;
    if (ucs4[uVar12] == 0) break;
    uVar12 = uVar12 + 1;
    uVar13 = uVar4;
  } while (uVar4 != uVar12);
  lVar11 = 0x400;
  puVar5 = (undefined1 *)malloc(0x400);
  __ptr = puVar5;
  if (uVar13 != 0) {
    uVar4 = 0;
    do {
      if (lVar11 < 7) {
        lVar11 = (long)puVar5 - (long)__ptr;
        __ptr = (undefined1 *)realloc(__ptr,lVar11 * 2);
        puVar5 = __ptr + lVar11;
      }
      uVar3 = ucs4[uVar4];
      if (uVar3 < 0x80) {
        lVar9 = 1;
LAB_00104232:
        *puVar5 = (char)uVar3;
        puVar5 = puVar5 + lVar9;
        lVar11 = lVar11 - lVar9;
        bVar2 = true;
      }
      else {
        bVar7 = (byte)uVar3;
        bVar1 = (byte)(uVar3 >> 8);
        if (uVar3 < 0x800) {
          puVar5[1] = bVar7 & 0x3f | 0x80;
          uVar3 = (uint)(byte)(((byte)(uVar3 >> 6) & 3) + bVar1 * '\x04' | 0xc0);
          lVar9 = 2;
          goto LAB_00104232;
        }
        if (uVar3 < 0x10000) {
          puVar5[2] = bVar7 & 0x3f | 0x80;
          puVar5[1] = ((byte)(uVar3 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
          uVar3 = (uint)(byte)((byte)(uVar3 >> 0xc) | 0xe0);
          lVar9 = 3;
          goto LAB_00104232;
        }
        uVar8 = uVar3 >> 0x10;
        if (uVar3 < 0x200000) {
          puVar5[3] = bVar7 & 0x3f | 0x80;
          puVar5[2] = ((byte)(uVar3 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
          puVar5[1] = (byte)((uVar8 & 3) << 4) | (byte)(uVar3 >> 0xc) & 0xf | 0x80;
          uVar3 = (uint)(byte)((byte)(uVar3 >> 0x12) | 0xf0);
          lVar9 = 4;
          goto LAB_00104232;
        }
        bVar10 = (byte)(uVar3 >> 0x18);
        if (uVar3 < 0x4000000) {
          puVar5[4] = bVar7 & 0x3f | 0x80;
          puVar5[3] = ((byte)(uVar3 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
          puVar5[2] = (byte)((uVar8 & 3) << 4) | (byte)(uVar3 >> 0xc) & 0xf | 0x80;
          puVar5[1] = (byte)(uVar3 >> 0x12) & 0x3f | 0x80;
          uVar3 = (uint)(bVar10 | 0xf8);
          lVar9 = 5;
          goto LAB_00104232;
        }
        if (-1 < (int)uVar3) {
          puVar5[5] = bVar7 & 0x3f | 0x80;
          puVar5[4] = ((byte)(uVar3 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
          puVar5[3] = (byte)((uVar8 & 3) << 4) | (byte)(uVar3 >> 0xc) & 0xf | 0x80;
          puVar5[2] = (byte)(uVar3 >> 0x12) & 0x3f | 0x80;
          puVar5[1] = bVar10 & 0x3f | 0x80;
          uVar3 = (uint)(byte)(bVar10 >> 6 | 0xfc);
          lVar9 = 6;
          goto LAB_00104232;
        }
        free(__ptr);
        bVar2 = false;
      }
      if (!bVar2) {
        return (char *)0xffffffffffffffff;
      }
      uVar4 = uVar4 + 1;
    } while (uVar13 != uVar4);
  }
  pcVar6 = (char *)realloc(__ptr,((long)puVar5 - (long)__ptr) + 1);
  pcVar6[(long)puVar5 - (long)__ptr] = '\0';
  return pcVar6;
}

Assistant:

char * ucs4_to_utf8(const ucs4_t * ucs4, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && ucs4[i] != 0; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	char * utf8 = (char *) malloc(sizeof(char) * freesize);
	char * putf8 = utf8;

	for (i = 0; i < length; i ++)
	{
		if ((ssize_t)freesize - 6 <= 0)
		{
			freesize = putf8 - utf8;
			utf8 = (char *) realloc(utf8, sizeof(char) * (freesize + freesize));
			putf8 = utf8 + freesize;
		}

		ucs4_t c = ucs4[i];
		ucs4_t byte[4] =
		{
			(c >> 0) & BITMASK(8), (c >> 8) & BITMASK(8),
			(c >> 16) & BITMASK(8), (c >> 24) & BITMASK(8)
		};
		
		size_t delta = 0;

		if (c <= 0x7F)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			putf8[0] = byte[0] & BITMASK(7);
			delta = 1;
		}
		else if (c <= 0x7FF)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			putf8[1] = 0x80 + (byte[0] & BITMASK(6));
			putf8[0] = 0xC0 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(3)) << 2);
			delta = 2;
		}
		else if (c <= 0xFFFF)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			putf8[2] = 0x80 + (byte[0] & BITMASK(6));
			putf8[1] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[0] = 0xE0 + ((byte[1] >> 4) & BITMASK(4));
			delta = 3;
		}
		else if (c <= 0x1FFFFF)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[3] = 0x80 + (byte[0] & BITMASK(6));
			putf8[2] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[1] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[0] = 0xF0 + ((byte[2] >> 2) & BITMASK(3));
			delta = 4;
		}
		else if (c <= 0x3FFFFFF)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[4] = 0x80 + (byte[0] & BITMASK(6));
			putf8[3] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[2] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[1] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[0] = 0xF8 + (byte[3] & BITMASK(2));
			delta = 5;

		}
		else if (c <= 0x7FFFFFFF)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[5] = 0x80 + (byte[0] & BITMASK(6));
			putf8[4] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[3] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[2] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[1] = 0x80 + (byte[3] & BITMASK(6));
			putf8[0] = 0xFC + ((byte[3] >> 6) & BITMASK(1)); 
			delta = 6;
		}
		else
		{
			free(utf8);
			return (char *) -1;
		}
		
		putf8 += delta;
		freesize -= delta;
	}

	length = (putf8 - utf8 + 1);
	utf8 = (char *) realloc(utf8, sizeof(char) * length);
	utf8[length - 1] = '\0';
	return utf8;
}